

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O1

put_transaction<int> * __thiscall
density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
start_push<int>(put_transaction<int> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
               *this,int *i_source)

{
  put_transaction<int> local_38;
  
  conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<int,int>
            (&local_38,
             (conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             this,i_source);
  (__return_storage_ptr__->m_lock)._M_device = local_38.m_lock._M_device;
  (__return_storage_ptr__->m_lock)._M_owns = local_38.m_lock._M_owns;
  local_38.m_lock._M_device = (mutex_type *)0x0;
  local_38.m_lock._M_owns = false;
  (__return_storage_ptr__->m_put_transaction).m_queue = local_38.m_put_transaction.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_38.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_38.m_put_transaction.m_put_data.m_user_storage;
  local_38.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  put_transaction<int>::~put_transaction(&local_38);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<typename std::decay<ELEMENT_TYPE>::type>
          start_push(ELEMENT_TYPE && i_source)
        {
            return start_emplace<typename std::decay<ELEMENT_TYPE>::type>(
              std::forward<ELEMENT_TYPE>(i_source));
        }